

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

UInt32 Bt2_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit_00;
  UInt32 curMatch_00;
  int iVar1;
  UInt32 *pUVar2;
  UInt32 *in_RSI;
  long *in_RDI;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hv;
  UInt32 lenLimit;
  UInt32 offset;
  UInt32 local_c;
  
  lenLimit_00 = *(uint *)((long)in_RDI + 0x14);
  if (lenLimit_00 < 2) {
    MatchFinder_MovePos((CMatchFinder *)0x120c4c);
    local_c = 0;
  }
  else {
    curMatch_00 = *(UInt32 *)(in_RDI[5] + (ulong)(uint)*(ushort *)*in_RDI * 4);
    *(int *)(in_RDI[5] + (ulong)(uint)*(ushort *)*in_RDI * 4) = (int)in_RDI[1];
    pUVar2 = GetMatchesSpec1(lenLimit_00,curMatch_00,*(UInt32 *)(in_RDI + 1),(Byte *)*in_RDI,
                             (CLzRef *)in_RDI[6],*(UInt32 *)(in_RDI + 3),
                             *(UInt32 *)((long)in_RDI + 0x1c),*(UInt32 *)((long)in_RDI + 0x3c),
                             in_RSI,1);
    local_c = (UInt32)((long)pUVar2 - (long)in_RSI >> 2);
    *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
    *in_RDI = *in_RDI + 1;
    iVar1 = (int)in_RDI[1] + 1;
    *(int *)(in_RDI + 1) = iVar1;
    if (iVar1 == *(int *)((long)in_RDI + 0xc)) {
      MatchFinder_CheckLimits((CMatchFinder *)0x120d6a);
    }
  }
  return local_c;
}

Assistant:

static UInt32 Bt2_MatchFinder_GetMatches(CMatchFinder *p, UInt32 *distances)
{
  UInt32 offset;
  GET_MATCHES_HEADER(2)
  HASH2_CALC;
  curMatch = p->hash[hv];
  p->hash[hv] = p->pos;
  offset = 0;
  GET_MATCHES_FOOTER(offset, 1)
}